

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

bool __thiscall Mat::operator==(Mat *this,Mat *p)

{
  pointer p_Var1;
  pointer p_Var2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar5 = this->c * this->r;
  bVar6 = (int)uVar5 < 1;
  if (0 < (int)uVar5) {
    p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var2 = (p->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar7[0] = -((char)*p_Var1 == (char)*p_Var2);
    auVar7[1] = -(*(char *)((long)p_Var1 + 1) == *(char *)((long)p_Var2 + 1));
    auVar7[2] = -(*(char *)((long)p_Var1 + 2) == *(char *)((long)p_Var2 + 2));
    auVar7[3] = -(*(char *)((long)p_Var1 + 3) == *(char *)((long)p_Var2 + 3));
    auVar7[4] = -(*(char *)((long)p_Var1 + 4) == *(char *)((long)p_Var2 + 4));
    auVar7[5] = -(*(char *)((long)p_Var1 + 5) == *(char *)((long)p_Var2 + 5));
    auVar7[6] = -(*(char *)((long)p_Var1 + 6) == *(char *)((long)p_Var2 + 6));
    auVar7[7] = -(*(char *)((long)p_Var1 + 7) == *(char *)((long)p_Var2 + 7));
    auVar7[8] = -(*(char *)((long)p_Var1 + 8) == *(char *)((long)p_Var2 + 8));
    auVar7[9] = -(*(char *)((long)p_Var1 + 9) == *(char *)((long)p_Var2 + 9));
    auVar7[10] = -(*(char *)((long)p_Var1 + 10) == *(char *)((long)p_Var2 + 10));
    auVar7[0xb] = -(*(char *)((long)p_Var1 + 0xb) == *(char *)((long)p_Var2 + 0xb));
    auVar7[0xc] = -(*(char *)((long)p_Var1 + 0xc) == *(char *)((long)p_Var2 + 0xc));
    auVar7[0xd] = -(*(char *)((long)p_Var1 + 0xd) == *(char *)((long)p_Var2 + 0xd));
    auVar7[0xe] = -(*(char *)((long)p_Var1 + 0xe) == *(char *)((long)p_Var2 + 0xe));
    auVar7[0xf] = -(*(char *)((long)p_Var1 + 0xf) == *(char *)((long)p_Var2 + 0xf));
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        == 0xffff) {
      uVar3 = 1;
      do {
        uVar4 = uVar3;
        if (uVar5 == uVar4) break;
        auVar8[0] = -((char)p_Var1[1] == (char)p_Var2[1]);
        auVar8[1] = -(*(char *)((long)p_Var1 + 0x11) == *(char *)((long)p_Var2 + 0x11));
        auVar8[2] = -(*(char *)((long)p_Var1 + 0x12) == *(char *)((long)p_Var2 + 0x12));
        auVar8[3] = -(*(char *)((long)p_Var1 + 0x13) == *(char *)((long)p_Var2 + 0x13));
        auVar8[4] = -(*(char *)((long)p_Var1 + 0x14) == *(char *)((long)p_Var2 + 0x14));
        auVar8[5] = -(*(char *)((long)p_Var1 + 0x15) == *(char *)((long)p_Var2 + 0x15));
        auVar8[6] = -(*(char *)((long)p_Var1 + 0x16) == *(char *)((long)p_Var2 + 0x16));
        auVar8[7] = -(*(char *)((long)p_Var1 + 0x17) == *(char *)((long)p_Var2 + 0x17));
        auVar8[8] = -(*(char *)((long)p_Var1 + 0x18) == *(char *)((long)p_Var2 + 0x18));
        auVar8[9] = -(*(char *)((long)p_Var1 + 0x19) == *(char *)((long)p_Var2 + 0x19));
        auVar8[10] = -(*(char *)((long)p_Var1 + 0x1a) == *(char *)((long)p_Var2 + 0x1a));
        auVar8[0xb] = -(*(char *)((long)p_Var1 + 0x1b) == *(char *)((long)p_Var2 + 0x1b));
        auVar8[0xc] = -(*(char *)((long)p_Var1 + 0x1c) == *(char *)((long)p_Var2 + 0x1c));
        auVar8[0xd] = -(*(char *)((long)p_Var1 + 0x1d) == *(char *)((long)p_Var2 + 0x1d));
        auVar8[0xe] = -(*(char *)((long)p_Var1 + 0x1e) == *(char *)((long)p_Var2 + 0x1e));
        auVar8[0xf] = -(*(char *)((long)p_Var1 + 0x1f) == *(char *)((long)p_Var2 + 0x1f));
        uVar3 = uVar4 + 1;
        p_Var1 = p_Var1 + 1;
        p_Var2 = p_Var2 + 1;
      } while ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff);
      bVar6 = uVar5 <= uVar4;
    }
  }
  return bVar6;
}

Assistant:

bool Mat::operator==(Mat p) {
    int l = r * c;
//    bool match = true;
    for (int i = 0; i < l; i++) {
        if (val[i] != p.getVal(i)) {
            return false;
        }
    }
    return true;
}